

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFModelExport.cpp
# Opt level: O3

bool iDynTree::exportSolidShape
               (SolidShape *solidShape,exportSolidShapePropertyType type,xmlNodePtr parent_element)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  xmlNodePtr parent_element_00;
  long *plVar6;
  Transform *trans;
  undefined8 uVar7;
  undefined8 *puVar8;
  undefined8 uVar9;
  VectorFixSize<3U> *in;
  char *pcVar10;
  ulong uVar11;
  double dVar12;
  string length_str;
  string shapeName;
  string element_name;
  string local_118;
  string local_f8;
  undefined1 local_d8;
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [3];
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  char *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  VectorFixSize<4U> local_58;
  
  local_88 = &local_78;
  local_80 = 0;
  local_78 = 0;
  pcVar10 = "collision";
  if (type == VISUAL) {
    pcVar10 = "visual";
  }
  std::__cxx11::string::_M_replace((ulong)&local_88,0,(char *)0x0,(ulong)pcVar10);
  parent_element_00 = (xmlNodePtr)xmlNewChild(parent_element,0,local_88,0);
  cVar3 = iDynTree::SolidShape::isNameValid();
  if (cVar3 != '\0') {
    plVar6 = (long *)iDynTree::SolidShape::getName_abi_cxx11_();
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_f8,*plVar6,plVar6[1] + *plVar6);
    xmlNewProp(parent_element_00,"name",local_f8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,
                      CONCAT44(local_f8.field_2._M_allocated_capacity._4_4_,
                               local_f8.field_2._M_allocated_capacity._0_4_) + 1);
    }
  }
  trans = (Transform *)iDynTree::SolidShape::getLink_H_geometry();
  bVar4 = exportTransform(trans,parent_element_00);
  uVar7 = xmlNewChild(parent_element_00,0,"geometry",0);
  cVar3 = iDynTree::SolidShape::isBox();
  if (cVar3 == '\0') {
    cVar3 = iDynTree::SolidShape::isCylinder();
    if (cVar3 == '\0') {
      cVar3 = iDynTree::SolidShape::isSphere();
      if (cVar3 == '\0') {
        cVar3 = iDynTree::SolidShape::isExternalMesh();
        if (cVar3 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "[ERROR] URDFModelExport: Impossible to convert geometry of type ",0x40);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"PKN8iDynTree10SolidShapeE",0x19);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr," to a URDF geometry.",0x14);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
          std::ostream::put('h');
          std::ostream::flush();
          bVar4 = false;
          goto LAB_00126ebc;
        }
        iDynTree::SolidShape::asExternalMesh();
        uVar7 = xmlNewChild(uVar7,0,"mesh",0);
        puVar8 = (undefined8 *)iDynTree::ExternalMesh::getFilename_abi_cxx11_();
        xmlNewProp(uVar7,"filename",*puVar8);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        local_f8._M_string_length = 0;
        local_f8.field_2._M_allocated_capacity._0_4_ =
             local_f8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
        if (bVar4) {
          in = (VectorFixSize<3U> *)iDynTree::ExternalMesh::getScale();
          bVar4 = vectorToString<iDynTree::VectorFixSize<3u>>(in,&local_f8);
        }
        else {
          bVar4 = false;
        }
        xmlNewProp(uVar7,"scale",local_f8._M_dataplus._M_p);
      }
      else {
        iDynTree::SolidShape::asSphere();
        uVar7 = xmlNewChild(uVar7,0,"sphere",0);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        local_f8._M_string_length = 0;
        local_f8.field_2._M_allocated_capacity._0_4_ =
             local_f8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
        if ((bVar4) &&
           (dVar12 = (double)iDynTree::Sphere::getRadius(), (ulong)ABS(dVar12) < 0x7ff0000000000000)
           ) {
          iVar5 = idyntree_private_fpconv_dtoa(dVar12,(char *)&local_118);
          *(undefined1 *)((long)&local_118._M_dataplus._M_p + (long)iVar5) = 0;
          sVar2 = local_f8._M_string_length;
          strlen((char *)&local_118);
          std::__cxx11::string::_M_replace((ulong)&local_f8,0,(char *)sVar2,(ulong)&local_118);
          bVar4 = true;
        }
        else {
          bVar4 = false;
        }
        xmlNewProp(uVar7,"radius",local_f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) goto LAB_00126c40;
    }
    else {
      iDynTree::SolidShape::asCylinder();
      uVar7 = xmlNewChild(uVar7,0,"cylinder",0);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      local_f8._M_string_length = 0;
      local_f8.field_2._M_allocated_capacity._0_4_ =
           local_f8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      if ((bVar4) &&
         (dVar12 = (double)iDynTree::Cylinder::getRadius(), (ulong)ABS(dVar12) < 0x7ff0000000000000)
         ) {
        iVar5 = idyntree_private_fpconv_dtoa(dVar12,(char *)&local_118);
        *(undefined1 *)((long)&local_118._M_dataplus._M_p + (long)iVar5) = 0;
        sVar2 = local_f8._M_string_length;
        strlen((char *)&local_118);
        std::__cxx11::string::_M_replace((ulong)&local_f8,0,(char *)sVar2,(ulong)&local_118);
        bVar4 = true;
      }
      else {
        bVar4 = false;
      }
      xmlNewProp(uVar7,"radius",local_f8._M_dataplus._M_p);
      paVar1 = &local_118.field_2;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity =
           local_118.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_118._M_dataplus._M_p = (pointer)paVar1;
      if ((bVar4) &&
         (dVar12 = (double)iDynTree::Cylinder::getLength(), (ulong)ABS(dVar12) < 0x7ff0000000000000)
         ) {
        iVar5 = idyntree_private_fpconv_dtoa(dVar12,(char *)&local_58);
        sVar2 = local_118._M_string_length;
        *(undefined1 *)((long)local_58.m_data + (long)iVar5) = 0;
        strlen((char *)&local_58);
        std::__cxx11::string::_M_replace((ulong)&local_118,0,(char *)sVar2,(ulong)&local_58);
        bVar4 = true;
      }
      else {
        bVar4 = false;
      }
      xmlNewProp(uVar7,"length",local_118._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar1) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
LAB_00126c40:
        operator_delete(local_f8._M_dataplus._M_p,
                        CONCAT44(local_f8.field_2._M_allocated_capacity._4_4_,
                                 local_f8.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
  }
  else {
    iDynTree::SolidShape::asBox();
    uVar7 = xmlNewChild(uVar7,0,"box",0);
    local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)iDynTree::Box::getX();
    local_68 = (char *)iDynTree::Box::getY();
    uVar11 = iDynTree::Box::getZ();
    paVar1 = &local_f8.field_2;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity._0_4_ =
         local_f8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    if (bVar4) {
      local_118._M_dataplus._M_p = (pointer)local_60;
      local_118._M_string_length = (size_type)local_68;
      local_118.field_2._M_allocated_capacity = uVar11;
      bVar4 = vectorToString<iDynTree::VectorFixSize<3u>>((VectorFixSize<3U> *)&local_118,&local_f8)
      ;
    }
    else {
      bVar4 = false;
    }
    xmlNewProp(uVar7,"size",local_f8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) goto LAB_00126c40;
  }
  cVar3 = iDynTree::SolidShape::isMaterialSet();
  if (cVar3 != '\0') {
    puVar8 = (undefined8 *)iDynTree::SolidShape::getMaterial();
    local_d8 = *(undefined1 *)(puVar8 + 4);
    local_f8._M_dataplus._M_p = (pointer)*puVar8;
    local_f8._M_string_length = puVar8[1];
    local_f8.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)(puVar8 + 2);
    local_f8.field_2._M_allocated_capacity._4_4_ = *(undefined4 *)((long)puVar8 + 0x14);
    local_f8.field_2._8_4_ = *(undefined4 *)(puVar8 + 3);
    local_f8.field_2._12_4_ = *(undefined4 *)((long)puVar8 + 0x1c);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char*>((string *)local_d0,puVar8[5],puVar8[6] + puVar8[5]);
    local_b0[0] = local_a0;
    std::__cxx11::string::_M_construct<char*>((string *)local_b0,puVar8[9],puVar8[10] + puVar8[9]);
    uVar7 = xmlNewChild(parent_element_00,0,"material",0);
    iDynTree::Material::name_abi_cxx11_();
    xmlNewProp(uVar7,"name",local_118._M_dataplus._M_p);
    paVar1 = &local_118.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    cVar3 = iDynTree::Material::hasColor();
    if (cVar3 != '\0') {
      uVar9 = xmlNewChild(uVar7,0,"color",0);
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity =
           local_118.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_118._M_dataplus._M_p = (pointer)paVar1;
      if (bVar4 == false) {
        bVar4 = false;
      }
      else {
        iDynTree::Material::color();
        bVar4 = vectorToString<iDynTree::VectorFixSize<4u>>(&local_58,&local_118);
      }
      xmlNewProp(uVar9,"rgba",local_118._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar1) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
    }
    cVar3 = iDynTree::Material::hasTexture();
    if (cVar3 != '\0') {
      uVar7 = xmlNewChild(uVar7,0,"texture",0);
      iDynTree::Material::texture_abi_cxx11_();
      xmlNewProp(uVar7,"filename",local_118._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar1) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0],local_a0[0] + 1);
    }
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
  }
LAB_00126ebc:
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
  }
  return bVar4;
}

Assistant:

bool exportSolidShape(const SolidShape* solidShape, exportSolidShapePropertyType type, xmlNodePtr parent_element)
{
    bool ok=true;
    std::string element_name;
    if (type == VISUAL) {
        element_name = "visual";
    } else {
        // assert(type == COLLISION)
        element_name = "collision";
    }

    xmlNodePtr root_shape_xml = xmlNewChild(parent_element, NULL, BAD_CAST element_name.c_str(), NULL);
    // Omit the name (that is an optional attribute) if the shape has no name
    if (solidShape->isNameValid()) {
        std::string shapeName = solidShape->getName();
        xmlNewProp(root_shape_xml, BAD_CAST "name", BAD_CAST shapeName.c_str());
    }

    // Export transform
    ok = ok && exportTransform(solidShape->getLink_H_geometry(), root_shape_xml);

    // Export geometry
    xmlNodePtr geometry_xml = xmlNewChild(root_shape_xml, NULL, BAD_CAST "geometry", NULL);

    if (solidShape->isBox()) {
        const Box* box = solidShape->asBox();

        // Export box element
        xmlNodePtr box_xml = xmlNewChild(geometry_xml, NULL, BAD_CAST "box", NULL);

        // Export size attribute
        double size_data[3] = {box->getX(), box->getY(), box->getZ()};
        std::string size_str;
        ok = ok && vectorToString(Vector3(size_data, 3) , size_str);
        xmlNewProp(box_xml, BAD_CAST "size", BAD_CAST size_str.c_str());

    } else if (solidShape->isCylinder()) {
        const Cylinder* cylinder = solidShape->asCylinder();

        // Export cylinder element
        xmlNodePtr cylinder_xml = xmlNewChild(geometry_xml, NULL, BAD_CAST "cylinder", NULL);

        // Export radius attribute
        std::string radius_str;
        ok = ok && doubleToStringWithClassicLocale(cylinder->getRadius(), radius_str);
        xmlNewProp(cylinder_xml, BAD_CAST "radius", BAD_CAST radius_str.c_str());

        // Export length attribute
        std::string length_str;
        ok = ok && doubleToStringWithClassicLocale(cylinder->getLength(), length_str);
        xmlNewProp(cylinder_xml, BAD_CAST "length", BAD_CAST length_str.c_str());

    } else if (solidShape->isSphere()) {
        const Sphere* sphere = solidShape->asSphere();

        // Export sphere  element
        xmlNodePtr sphere_xml = xmlNewChild(geometry_xml, NULL, BAD_CAST "sphere", NULL);

        // Export radius attribute
        std::string radius_str;
        ok = ok && doubleToStringWithClassicLocale(sphere->getRadius(), radius_str);
        xmlNewProp(sphere_xml, BAD_CAST "radius", BAD_CAST radius_str.c_str());

    } else if (solidShape->isExternalMesh()) {
        const ExternalMesh* mesh = solidShape->asExternalMesh();

        // Export mesh element
        xmlNodePtr mesh_xml = xmlNewChild(geometry_xml, NULL, BAD_CAST "mesh", NULL);

        // Export filename attribute
        xmlNewProp(mesh_xml, BAD_CAST "filename", BAD_CAST mesh->getFilename().c_str());

        // Export scale attribute
        std::string scale_str;
        ok = ok && vectorToString(mesh->getScale(), scale_str);
        xmlNewProp(mesh_xml, BAD_CAST "scale", BAD_CAST scale_str.c_str());

    } else {
        std::cerr << "[ERROR] URDFModelExport: Impossible to convert geometry of type "
                  <<  typeid(solidShape).name() << " to a URDF geometry." << std::endl;
        return false;
    }

    // Export material if set.
    if (solidShape->isMaterialSet()) {
        auto material = solidShape->getMaterial();
        xmlNodePtr material_xml = xmlNewChild(root_shape_xml, NULL, BAD_CAST "material", NULL);
        xmlNewProp(material_xml, BAD_CAST "name", BAD_CAST material.name().c_str());

        if (material.hasColor()) {
            xmlNodePtr color_xml = xmlNewChild(material_xml, NULL, BAD_CAST "color", NULL);
            std::string material_str;
            ok = ok && vectorToString(material.color(), material_str);
            xmlNewProp(color_xml, BAD_CAST "rgba", BAD_CAST material_str.c_str());
        }
        if (material.hasTexture()) {
            xmlNodePtr texture_xml = xmlNewChild(material_xml, NULL, BAD_CAST "texture", NULL);
            xmlNewProp(texture_xml, BAD_CAST "filename", BAD_CAST material.texture().c_str());
        }
    }

    return ok;
}